

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O3

int Cnf_CountCnfSize(Aig_Man_t *p)

{
  Aig_Obj_t *pRoot;
  int iVar1;
  Vec_Ptr_t *vSuper;
  void **ppvVar2;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vCover;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  long lVar6;
  Aig_Man_t *p_00;
  uint uVar7;
  
  vSuper = (Vec_Ptr_t *)malloc(0x10);
  vSuper->nCap = 100;
  vSuper->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vSuper->pArray = ppvVar2;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vNodes->pArray = ppvVar2;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar3 = (int *)malloc(0x40000);
  vCover->pArray = piVar3;
  pVVar4 = p->vObjs;
  iVar1 = pVVar4->nSize;
  if ((long)iVar1 < 1) {
    uVar7 = 0;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    do {
      if (pVVar4->pArray[lVar6] != (void *)0x0) {
        uVar7 = uVar7 + ((*(uint *)((long)pVVar4->pArray[lVar6] + 0x18) >> 4 & 1) != 0);
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
    if (0 < iVar1) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pRoot = (Aig_Obj_t *)pVVar4->pArray[lVar6];
        if (((pRoot != (Aig_Obj_t *)0x0) && ((*(ulong *)&pRoot->field_0x18 & 0x10) != 0)) &&
           (0xfffffffd < ((uint)*(ulong *)&pRoot->field_0x18 & 7) - 7)) {
          Cnf_CollectLeaves(pRoot,vSuper,0);
          p_00 = p;
          Cnf_CollectVolume(p,pRoot,vSuper,vNodes);
          if ((long)vNodes->nSize < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
          }
          if (pRoot != (Aig_Obj_t *)vNodes->pArray[(long)vNodes->nSize + -1]) {
            __assert_fail("pObj == Vec_PtrEntryLast(vNodes)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                          ,0x205,"int Cnf_CountCnfSize(Aig_Man_t *)");
          }
          iVar1 = Cnf_CutCountClauses(p_00,vSuper,vNodes,vCover);
          uVar5 = uVar5 + iVar1;
          pVVar4 = p->vObjs;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
      goto LAB_00506dd3;
    }
  }
  uVar5 = 0;
LAB_00506dd3:
  printf("Vars = %d  Clauses = %d\n",(ulong)uVar7,(ulong)uVar5);
  if (vSuper->pArray != (void **)0x0) {
    free(vSuper->pArray);
  }
  free(vSuper);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
  }
  free(vCover);
  return uVar5;
}

Assistant:

int Cnf_CountCnfSize( Aig_Man_t * p )
{
    Vec_Ptr_t * vLeaves, * vNodes;
    Vec_Int_t * vCover;
    Aig_Obj_t * pObj;
    int nVars = 0, nClauses = 0;
    int i, nSize;

    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vCover  = Vec_IntAlloc( 1 << 16 );

    Aig_ManForEachObj( p, pObj, i )
        nVars += pObj->fMarkA;

    Aig_ManForEachNode( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        Cnf_CollectLeaves( pObj, vLeaves, 0 );
        Cnf_CollectVolume( p, pObj, vLeaves, vNodes );
        assert( pObj == Vec_PtrEntryLast(vNodes) );

        nSize = Cnf_CutCountClauses( p, vLeaves, vNodes, vCover );
//        printf( "%d(%d) ", Vec_PtrSize(vLeaves), nSize );

        nClauses += nSize;
    }
//    printf( "\n" );
    printf( "Vars = %d  Clauses = %d\n", nVars, nClauses );

    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vCover );
    return nClauses;
}